

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O1

void __thiscall merc::KeywordNode::~KeywordNode(KeywordNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_00109d88;
  pcVar2 = (this->super_ASTNode).Content._M_dataplus._M_p;
  paVar1 = &(this->super_ASTNode).Content.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

~KeywordNode() = default;